

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
diy::RegularLink<diy::Bounds<float>_>::RegularLink
          (RegularLink<diy::Bounds<float>_> *this,int dim,Bounds *core__,Bounds *bounds__)

{
  type in_ESI;
  Bounds<float> *in_RDI;
  Registrar<diy::RegularLink<diy::Bounds<float>_>_> *in_stack_ffffffffffffffb0;
  Bounds<float> *pBVar1;
  
  Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<float>_>_>::Registrar
            (in_stack_ffffffffffffffb0);
  *(undefined ***)&(in_RDI->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_> =
       &PTR_id_abi_cxx11__0031d5d8;
  (in_RDI->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_static_data[0] =
       in_ESI;
  Catch::clara::std::
  map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
  ::map((map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
         *)0x1ad2aa);
  pBVar1 = (Bounds<float> *)
           &(in_RDI->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_capacity;
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1ad2bd);
  Bounds<float>::Bounds(in_RDI,pBVar1);
  Bounds<float>::Bounds(in_RDI,pBVar1);
  Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::vector
            ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)0x1ad300);
  Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::vector
            ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)0x1ad311);
  Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::vector
            ((vector<diy::Direction,_std::allocator<diy::Direction>_> *)0x1ad322);
  return;
}

Assistant:

RegularLink(int dim, const Bounds& core__, const Bounds& bounds__):
                  dim_(dim), core_(core__), bounds_(bounds__) {}